

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Collect.h
# Opt level: O0

void __thiscall
async_simple::coro::detail::
CollectAnyVariadicPairAwaiter<std::pair<async_simple::coro::Lazy<async_simple::Try<void>_>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qicosmos[P]cinatra/tests/test_cinatra.cpp:1143:37)>,_std::pair<async_simple::coro::Lazy<async_simple::Try<void>_>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qicosmos[P]cinatra/tests/test_cinatra.cpp:1149:37)>_>
::~CollectAnyVariadicPairAwaiter
          (CollectAnyVariadicPairAwaiter<std::pair<async_simple::coro::Lazy<async_simple::Try<void>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_qicosmos[P]cinatra_tests_test_cinatra_cpp:1143:37)>,_std::pair<async_simple::coro::Lazy<async_simple::Try<void>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_qicosmos[P]cinatra_tests_test_cinatra_cpp:1149:37)>_>
           *this)

{
  std::shared_ptr<std::optional<unsigned_long>_>::~shared_ptr
            ((shared_ptr<std::optional<unsigned_long>_> *)0x4a5f5c);
  std::
  tuple<std::pair<async_simple::coro::Lazy<async_simple::Try<void>_>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qicosmos[P]cinatra/tests/test_cinatra.cpp:1143:37)>,_std::pair<async_simple::coro::Lazy<async_simple::Try<void>_>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qicosmos[P]cinatra/tests/test_cinatra.cpp:1149:37)>_>
  ::~tuple((tuple<std::pair<async_simple::coro::Lazy<async_simple::Try<void>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_qicosmos[P]cinatra_tests_test_cinatra_cpp:1143:37)>,_std::pair<async_simple::coro::Lazy<async_simple::Try<void>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_qicosmos[P]cinatra_tests_test_cinatra_cpp:1149:37)>_>
            *)0x4a5f66);
  return;
}

Assistant:

CollectAnyVariadicPairAwaiter(Ts&&... inputs)
        : _input(std::move(inputs)...), _result(nullptr) {}